

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O0

workspace_list * workspace_list_create(size_t count)

{
  map *pmVar1;
  void *pvVar2;
  workspace_list *workspace_list;
  size_t count_local;
  
  count_local = (size_t)malloc(0x28);
  if ((size_t *)count_local == (size_t *)0x0) {
    count_local = 0;
  }
  else {
    *(size_t *)count_local = count;
    *(size_t *)(count_local + 0x10) = 0;
    pmVar1 = map_init();
    *(map **)(count_local + 0x18) = pmVar1;
    if (*(size_t *)(count_local + 0x18) == 0) {
      free((void *)count_local);
      count_local = 0;
    }
    else {
      map_set_key_compare_function(*(map **)(count_local + 0x18),compare_windows);
      map_set_key_size_function(*(map **)(count_local + 0x18),get_client_list_key_size);
      pvVar2 = calloc(count,8);
      *(void **)(count_local + 0x20) = pvVar2;
      if (*(size_t *)(count_local + 0x20) == 0) {
        map_destroy(*(map **)(count_local + 0x18));
        free((void *)count_local);
        count_local = 0;
      }
    }
  }
  return (workspace_list *)count_local;
}

Assistant:

struct workspace_list *workspace_list_create(size_t count)
{
        struct workspace_list *workspace_list = malloc(sizeof(struct workspace_list));

        if (workspace_list == NULL) {
                return NULL;
        }

        workspace_list->count = count;
        workspace_list->theme = NULL;
        workspace_list->client_map = map_init();

        if (workspace_list->client_map == NULL) {
                free(workspace_list);

                return NULL;
        }

        map_set_key_compare_function(workspace_list->client_map, compare_windows);
        map_set_key_size_function(workspace_list->client_map, get_client_list_key_size);

        workspace_list->workspaces = calloc(count, sizeof(struct workspace *));

        if (workspace_list->workspaces == NULL) {
                map_destroy(workspace_list->client_map);

                free(workspace_list);

                return NULL;
        }

        return workspace_list;
}